

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O2

Diagnostics * __thiscall
slang::ast::EvalContext::getAllDiagnostics(Diagnostics *__return_storage_ptr__,EvalContext *this)

{
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)(__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  SmallVectorBase<slang::Diagnostic>::append_range<slang::Diagnostics>
            ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,&this->diags);
  SmallVectorBase<slang::Diagnostic>::append_range<slang::Diagnostics>
            ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,&this->warnings);
  return __return_storage_ptr__;
}

Assistant:

Diagnostics EvalContext::getAllDiagnostics() const {
    Diagnostics results;
    results.append_range(diags);
    results.append_range(warnings);
    return results;
}